

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

void ssl_calc_verify_tls_sha256(mbedtls_ssl_context *ssl,uchar *hash)

{
  mbedtls_sha256_context sha256;
  mbedtls_sha256_context local_84;
  
  mbedtls_sha256_init(&local_84);
  mbedtls_sha256_clone(&local_84,&ssl->handshake->fin_sha256);
  mbedtls_sha256_finish_ret(&local_84,hash);
  mbedtls_sha256_free(&local_84);
  return;
}

Assistant:

void ssl_calc_verify_tls_sha256( mbedtls_ssl_context *ssl, unsigned char hash[32] )
{
    mbedtls_sha256_context sha256;

    mbedtls_sha256_init( &sha256 );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify sha256" ) );

    mbedtls_sha256_clone( &sha256, &ssl->handshake->fin_sha256 );
    mbedtls_sha256_finish_ret( &sha256, hash );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 32 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_sha256_free( &sha256 );

    return;
}